

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::dynamic_string>::erase
          (vector<crnlib::dynamic_string> *this,uint start,uint n)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint in_EDX;
  uint in_ESI;
  dynamic_string *in_RDI;
  dynamic_string *pSrc;
  dynamic_string *pDst;
  uint num_to_move;
  uint in_stack_ffffffffffffffcc;
  
  if ((in_ESI + in_EDX <= *(uint *)&in_RDI->m_pStr) && (in_EDX != 0)) {
    iVar1 = *(int *)&in_RDI->m_pStr;
    lVar2 = *(long *)in_RDI;
    lVar3 = *(long *)in_RDI;
    scalar_type<crnlib::dynamic_string>::destruct_array(in_RDI,in_stack_ffffffffffffffcc);
    memmove((void *)(lVar2 + (ulong)in_ESI * 0x10),
            (void *)(lVar3 + (ulong)in_ESI * 0x10 + (ulong)in_EDX * 0x10),
            (ulong)(iVar1 - (in_ESI + in_EDX)) << 4);
    *(uint *)&in_RDI->m_pStr = *(int *)&in_RDI->m_pStr - in_EDX;
  }
  return;
}

Assistant:

inline void erase(uint start, uint n) {
    CRNLIB_ASSERT((start + n) <= m_size);
    if ((start + n) > m_size)
      return;

    if (!n)
      return;

    const uint num_to_move = m_size - (start + n);

    T* pDst = m_p + start;

    const T* pSrc = m_p + start + n;

    if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(T)) {
      // This test is overly cautious.
      if ((!CRNLIB_IS_BITWISE_COPYABLE(T)) || (CRNLIB_HAS_DESTRUCTOR(T))) {
        // Type has been marked explictly as bitwise movable, which means we can move them around but they may need to be destructed.
        // First destroy the erased objects.
        scalar_type<T>::destruct_array(pDst, n);
      }

      // Copy "down" the objects to preserve, filling in the empty slots.
      memmove(pDst, pSrc, num_to_move * sizeof(T));
    } else {
      // Type is not bitwise copyable or movable.
      // Move them down one at a time by using the equals operator, and destroying anything that's left over at the end.
      T* pDst_end = pDst + num_to_move;
      while (pDst != pDst_end)
        *pDst++ = *pSrc++;

      scalar_type<T>::destruct_array(pDst_end, n);
    }

    m_size -= n;
  }